

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O0

double __thiscall ProblemAloha::backlogToReward(ProblemAloha *this,Index backlog)

{
  undefined1 auVar1 [16];
  undefined4 in_ESI;
  long in_RDI;
  __type _Var2;
  undefined1 in_ZMM0 [64];
  double reward;
  double in_stack_ffffffffffffffd8;
  undefined8 local_18;
  
  local_18 = 42.0;
  if (*(uint *)(in_RDI + 0x708) < 3) {
    auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,in_ESI);
    local_18 = -auVar1._0_8_;
  }
  else if (*(uint *)(in_RDI + 0x708) == 3) {
    vcvtusi2sd_avx512f(in_ZMM0._0_16_,in_ESI);
    _Var2 = std::pow<int,double>(3,in_stack_ffffffffffffffd8);
    local_18 = 1.0 - _Var2;
  }
  return local_18;
}

Assistant:

double ProblemAloha::backlogToReward(Index backlog) const
{
    double reward=42;
    switch(_m_variation)
    {
    case NewPacket:
    case NewPacketSendAll:
    case NoNewPacket:
        reward=-static_cast<double>(backlog);
        break;
    case NewPacketProgressivePenalty:
        reward=1-pow(2,static_cast<double>(backlog));
        break;
    }
    return(reward);
}